

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

bool __thiscall
DependencyScan::VerifyDAG
          (DependencyScan *this,Node *node,vector<Node_*,_std::allocator<Node_*>_> *stack,
          string *err)

{
  bool bVar1;
  bool bVar2;
  Edge *pEVar3;
  reference ppNVar4;
  reference ppNVar5;
  bool local_89;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_70;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_68;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_60;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_58;
  const_iterator i;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_48;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_40;
  iterator start;
  Edge *edge;
  string *err_local;
  vector<Node_*,_std::allocator<Node_*>_> *stack_local;
  Node *node_local;
  DependencyScan *this_local;
  
  start._M_current = (Node **)Node::in_edge(node);
  if ((Edge *)start._M_current == (Edge *)0x0) {
    __assert_fail("edge != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph.cc",
                  0xe4,"bool DependencyScan::VerifyDAG(Node *, vector<Node *> *, string *)");
  }
  if (((Edge *)start._M_current)->mark_ == VisitInStack) {
    local_40._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(stack);
    while( true ) {
      local_48._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(stack);
      bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
      bVar2 = false;
      if (bVar1) {
        ppNVar4 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_40);
        pEVar3 = Node::in_edge(*ppNVar4);
        bVar2 = pEVar3 != (Edge *)start._M_current;
      }
      if (!bVar2) break;
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_40);
    }
    i._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(stack);
    bVar2 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> *)
                       &i);
    if (!bVar2) {
      __assert_fail("start != stack->end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph.cc"
                    ,0xee,"bool DependencyScan::VerifyDAG(Node *, vector<Node *> *, string *)");
    }
    ppNVar4 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_40);
    *ppNVar4 = node;
    std::__cxx11::string::operator=((string *)err,"dependency cycle: ");
    __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
    __normal_iterator<Node**>
              ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)&local_58,
               &local_40);
    while( true ) {
      local_60._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(stack);
      bVar2 = __gnu_cxx::operator!=(&local_58,&local_60);
      if (!bVar2) break;
      ppNVar5 = __gnu_cxx::
                __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                operator*(&local_58);
      Node::path_abi_cxx11_(*ppNVar5);
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::append((char *)err);
      __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_58);
    }
    ppNVar4 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_40);
    Node::path_abi_cxx11_(*ppNVar4);
    std::__cxx11::string::append((string *)err);
    local_68 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
               ::operator+(&local_40,1);
    local_70._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(stack);
    bVar2 = __gnu_cxx::operator==(&local_68,&local_70);
    local_89 = false;
    if (bVar2) {
      local_89 = Edge::maybe_phonycycle_diagnostic((Edge *)start._M_current);
    }
    if (local_89 != false) {
      std::__cxx11::string::append((char *)err);
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DependencyScan::VerifyDAG(Node* node, vector<Node*>* stack, string* err) {
  Edge* edge = node->in_edge();
  assert(edge != NULL);

  // If we have no temporary mark on the edge then we do not yet have a cycle.
  if (edge->mark_ != Edge::VisitInStack)
    return true;

  // We have this edge earlier in the call stack.  Find it.
  vector<Node*>::iterator start = stack->begin();
  while (start != stack->end() && (*start)->in_edge() != edge)
    ++start;
  assert(start != stack->end());

  // Make the cycle clear by reporting its start as the node at its end
  // instead of some other output of the starting edge.  For example,
  // running 'ninja b' on
  //   build a b: cat c
  //   build c: cat a
  // should report a -> c -> a instead of b -> c -> a.
  *start = node;

  // Construct the error message rejecting the cycle.
  *err = "dependency cycle: ";
  for (vector<Node*>::const_iterator i = start; i != stack->end(); ++i) {
    err->append((*i)->path());
    err->append(" -> ");
  }
  err->append((*start)->path());

  if ((start + 1) == stack->end() && edge->maybe_phonycycle_diagnostic()) {
    // The manifest parser would have filtered out the self-referencing
    // input if it were not configured to allow the error.
    err->append(" [-w phonycycle=err]");
  }

  return false;
}